

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

string * __thiscall
re2::ProgToString_abi_cxx11_(string *__return_storage_ptr__,re2 *this,Prog *prog,Workq *q)

{
  int iVar1;
  int iVar2;
  string *psVar3;
  uint uVar4;
  string *psVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  Inst *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  string local_70;
  string local_50;
  
  psVar3 = (string *)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)psVar3;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1._0_1_ = prog->anchor_start_;
  iVar1._1_1_ = prog->anchor_end_;
  iVar1._2_1_ = prog->reversed_;
  iVar1._3_1_ = prog->did_flatten_;
  if (iVar1 != 0) {
    psVar5 = *(string **)&prog->list_count_;
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)psVar3;
    do {
      uVar4 = *(uint *)&(psVar5->_M_dataplus)._M_p;
      this_00 = (Inst *)((long)(int)uVar4 * 8 + *(long *)(this + 0x60));
      Prog::Inst::Dump_abi_cxx11_(&local_50,this_00);
      StringPrintf_abi_cxx11_
                (&local_70,"%d. %s\n",(ulong)uVar4,local_50._M_dataplus._M_p,in_R8,in_R9,paVar6);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      uVar4 = this_00->out_opcode_;
      if (0xf < uVar4) {
        SparseSetT<void>::InsertInternal((SparseSetT<void> *)prog,true,uVar4 >> 4);
        uVar4 = this_00->out_opcode_;
      }
      if (((uVar4 & 6) == 0) && ((this_00->field_1).cap_ != 0)) {
        SparseSetT<void>::InsertInternal((SparseSetT<void> *)prog,true,(this_00->field_1).cap_);
      }
      psVar5 = (string *)((long)&(psVar5->_M_dataplus)._M_p + 4);
      iVar2._0_1_ = prog->anchor_start_;
      iVar2._1_1_ = prog->anchor_end_;
      iVar2._2_1_ = prog->reversed_;
      iVar2._3_1_ = prog->did_flatten_;
      psVar3 = (string *)((long)iVar2 * 4 + *(long *)&prog->list_count_);
    } while (psVar5 != psVar3);
  }
  return psVar3;
}

Assistant:

void Prog::Optimize() {
  Workq q(size_);

  // Eliminate nops.  Most are taken out during compilation
  // but a few are hard to avoid.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;

    Inst* ip = inst(id);
    int j = ip->out();
    Inst* jp;
    while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
      j = jp->out();
    }
    ip->set_out(j);
    AddToQueue(&q, ip->out());

    if (ip->opcode() == kInstAlt) {
      j = ip->out1();
      while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
        j = jp->out();
      }
      ip->out1_ = j;
      AddToQueue(&q, ip->out1());
    }
  }

  // Insert kInstAltMatch instructions
  // Look for
  //   ip: Alt -> j | k
  //	  j: ByteRange [00-FF] -> ip
  //    k: Match
  // or the reverse (the above is the greedy one).
  // Rewrite Alt to AltMatch.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;
    Inst* ip = inst(id);
    AddToQueue(&q, ip->out());
    if (ip->opcode() == kInstAlt)
      AddToQueue(&q, ip->out1());

    if (ip->opcode() == kInstAlt) {
      Inst* j = inst(ip->out());
      Inst* k = inst(ip->out1());
      if (j->opcode() == kInstByteRange && j->out() == id &&
          j->lo() == 0x00 && j->hi() == 0xFF &&
          IsMatch(this, k)) {
        ip->set_opcode(kInstAltMatch);
        continue;
      }
      if (IsMatch(this, j) &&
          k->opcode() == kInstByteRange && k->out() == id &&
          k->lo() == 0x00 && k->hi() == 0xFF) {
        ip->set_opcode(kInstAltMatch);
      }
    }
  }
}